

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O2

void aom_hadamard_16x16_c(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  tran_low_t tVar1;
  int i;
  int iVar2;
  int j;
  int iVar3;
  long lVar4;
  int iVar5;
  tran_low_t *ptVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  bool bVar11;
  
  uVar7 = 0;
  ptVar6 = coeff;
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 4) {
    aom_hadamard_8x8_c(src_diff + (ulong)((uint)lVar10 & 8) * src_stride + (ulong)(uVar7 & 8),
                       src_stride,ptVar6);
    ptVar6 = ptVar6 + 0x40;
    uVar7 = uVar7 + 8;
  }
  ptVar6 = coeff + -0x38;
  iVar2 = 0x40;
  while (bVar11 = iVar2 != 0, iVar2 = iVar2 + -1, bVar11) {
    iVar9 = ptVar6[0x78] + ptVar6[0x38] >> 1;
    iVar3 = ptVar6[0x38] - ptVar6[0x78] >> 1;
    iVar8 = ptVar6[0xf8] + ptVar6[0xb8] >> 1;
    iVar5 = ptVar6[0xb8] - ptVar6[0xf8] >> 1;
    ptVar6[0x38] = iVar8 + iVar9;
    ptVar6[0x78] = iVar5 + iVar3;
    ptVar6[0xb8] = iVar9 - iVar8;
    ptVar6[0xf8] = iVar3 - iVar5;
    ptVar6 = ptVar6 + 1;
  }
  for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
    for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
      tVar1 = ptVar6[lVar4 + -4];
      ptVar6[lVar4 + -4] = ptVar6[lVar4];
      ptVar6[lVar4] = tVar1;
    }
    ptVar6 = ptVar6 + 0x10;
  }
  return;
}

Assistant:

void aom_hadamard_16x16_c(const int16_t *src_diff, ptrdiff_t src_stride,
                          tran_low_t *coeff) {
  int idx;
  for (idx = 0; idx < 4; ++idx) {
    // src_diff: 9 bit, dynamic range [-255, 255]
    const int16_t *src_ptr =
        src_diff + (idx >> 1) * 8 * src_stride + (idx & 0x01) * 8;
    aom_hadamard_8x8_c(src_ptr, src_stride, coeff + idx * 64);
  }

  // coeff: 15 bit, dynamic range [-16320, 16320]
  for (idx = 0; idx < 64; ++idx) {
    tran_low_t a0 = coeff[0];
    tran_low_t a1 = coeff[64];
    tran_low_t a2 = coeff[128];
    tran_low_t a3 = coeff[192];

    tran_low_t b0 = (a0 + a1) >> 1;  // (a0 + a1): 16 bit, [-32640, 32640]
    tran_low_t b1 = (a0 - a1) >> 1;  // b0-b3: 15 bit, dynamic range
    tran_low_t b2 = (a2 + a3) >> 1;  // [-16320, 16320]
    tran_low_t b3 = (a2 - a3) >> 1;

    coeff[0] = b0 + b2;  // 16 bit, [-32640, 32640]
    coeff[64] = b1 + b3;
    coeff[128] = b0 - b2;
    coeff[192] = b1 - b3;

    ++coeff;
  }

  coeff -= 64;
  // Extra shift to match AVX2 output (i.e., aom_hadamard_16x16_avx2).
  // Note that to match SSE2 output, it does not need this step.
  for (int i = 0; i < 16; i++) {
    for (int j = 0; j < 4; j++) {
      tran_low_t temp = coeff[i * 16 + 4 + j];
      coeff[i * 16 + 4 + j] = coeff[i * 16 + 8 + j];
      coeff[i * 16 + 8 + j] = temp;
    }
  }
}